

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mf_common.cpp
# Opt level: O0

double sum_cnt(vector<Triplet,_std::allocator<Triplet>_> *data_vec)

{
  size_type sVar1;
  reference pvVar2;
  int local_1c;
  double dStack_18;
  int i;
  double sum;
  vector<Triplet,_std::allocator<Triplet>_> *data_vec_local;
  
  dStack_18 = 0.0;
  local_1c = 0;
  while( true ) {
    sVar1 = std::vector<Triplet,_std::allocator<Triplet>_>::size(data_vec);
    if (sVar1 <= (ulong)(long)local_1c) break;
    pvVar2 = std::vector<Triplet,_std::allocator<Triplet>_>::operator[](data_vec,(long)local_1c);
    dStack_18 = pvVar2->cnt + dStack_18;
    local_1c = local_1c + 1;
  }
  return dStack_18;
}

Assistant:

double sum_cnt(vector<Triplet> &data_vec) {
    double sum = 0;
    for (int i = 0; i < data_vec.size(); i++) {
        sum += data_vec[i].cnt;
    }
    return sum;
}